

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstDebugPrintfPass::NewMemberName
          (InstDebugPrintfPass *this,uint32_t id,uint32_t member_index,string *name_str)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  long lVar1;
  undefined4 in_register_00000034;
  string *in_R8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  int local_184 [3];
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_178;
  IRContext *local_170;
  uint local_168;
  uint32_t local_164;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  initializer_list<spvtools::opt::Operand> local_148;
  SmallVector<unsigned_int,_2UL> local_138;
  SmallVector<unsigned_int,_2UL> local_110;
  SmallVector<unsigned_int,_2UL> local_e8;
  Operand local_c0;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_170 = *(IRContext **)(CONCAT44(in_register_00000034,id) + 0x28);
  local_184[1] = 0;
  local_184[0] = 0;
  init_list._M_len = 1;
  init_list._M_array = &local_164;
  local_184[2] = 6;
  local_178._M_head_impl = (Instruction *)this;
  local_164 = member_index;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list);
  local_c0.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0.words,&local_e8);
  local_168 = (uint)name_str;
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_168;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_00);
  local_90 = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_110);
  utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_160,in_R8);
  this_00._M_head_impl = local_178._M_head_impl;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            (&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_160);
  local_60 = 0xb;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_138);
  local_148._M_array = &local_c0;
  local_148._M_len = 3;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this_00._M_head_impl,&local_170,(Op *)(local_184 + 2),local_184 + 1,
             local_184,&local_148);
  lVar1 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)((long)(local_c0.words.buffer + -6) + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_138);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_160);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Instruction> InstDebugPrintfPass::NewMemberName(
    uint32_t id, uint32_t member_index, const std::string& name_str) {
  return MakeUnique<Instruction>(
      context(), spv::Op::OpMemberName, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {id}},
          {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index}},
          {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}});
}